

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void extend_frame_borders(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  YV12_BUFFER_CONFIG *ybf;
  _Bool extend_border_done;
  int plane;
  AV1_COMMON *cm;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  YV12_BUFFER_CONFIG *in_stack_00000088;
  undefined1 local_25;
  long in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  while( true ) {
    iVar3 = iVar2;
    iVar1 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    if (iVar1 <= iVar2) break;
    iVar2 = extend_borders_mt((AV1_COMP *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                              (MULTI_THREADED_MODULES)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                              (int)in_stack_ffffffffffffffe0);
    local_25 = true;
    if (iVar2 == 0) {
      iVar2 = extend_borders_mt((AV1_COMP *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                                (MULTI_THREADED_MODULES)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                                (int)in_stack_ffffffffffffffe0);
      local_25 = iVar2 != 0;
    }
    in_stack_ffffffffffffffe8 = CONCAT13(local_25,(int3)in_stack_ffffffffffffffe8);
    if (local_25 == false) {
      in_stack_ffffffffffffffe0 = *(long *)(in_RDI + 0x3c068) + 0x4e0;
      aom_extend_frame_borders_plane_row_c
                (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007c);
    }
    iVar2 = iVar3 + 1;
  }
  return;
}

Assistant:

static void extend_frame_borders(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  // TODO(debargha): Fix mv search range on encoder side
  for (int plane = 0; plane < av1_num_planes(cm); ++plane) {
    const bool extend_border_done = extend_borders_mt(cpi, MOD_CDEF, plane) ||
                                    extend_borders_mt(cpi, MOD_LR, plane);
    if (!extend_border_done) {
      const YV12_BUFFER_CONFIG *const ybf = &cm->cur_frame->buf;
      aom_extend_frame_borders_plane_row(ybf, plane, 0,
                                         ybf->crop_heights[plane > 0]);
    }
  }
}